

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::WaitForkStatementSyntax::setChild
          (WaitForkStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0052b3ec + *(int *)(&DAT_0052b3ec + index * 4)))();
  return;
}

Assistant:

void WaitForkStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait = child.token(); return;
        case 3: fork = child.token(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}